

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_encoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialNormalAttributeEncoder::Init
          (SequentialNormalAttributeEncoder *this,PointCloudEncoder *encoder,int attribute_id)

{
  EncoderOptions *this_00;
  bool bVar1;
  int quantization_bits;
  int local_4c;
  string local_48;
  
  local_4c = attribute_id;
  bVar1 = SequentialIntegerAttributeEncoder::Init
                    (&this->super_SequentialIntegerAttributeEncoder,encoder,attribute_id);
  if ((bVar1) &&
     ((((this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.attribute_)
      ->super_GeometryAttribute).num_components_ == '\x03')) {
    this_00 = encoder->options_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"quantization_bits","");
    quantization_bits =
         DracoOptions<int>::GetAttributeInt
                   (&this_00->super_DracoOptions<int>,&local_4c,&local_48,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (0 < quantization_bits) {
      AttributeOctahedronTransform::SetParameters
                (&this->attribute_octahedron_transform_,quantization_bits);
      return true;
    }
  }
  return false;
}

Assistant:

bool SequentialNormalAttributeEncoder::Init(PointCloudEncoder *encoder,
                                            int attribute_id) {
  if (!SequentialIntegerAttributeEncoder::Init(encoder, attribute_id)) {
    return false;
  }
  // Currently this encoder works only for 3-component normal vectors.
  if (attribute()->num_components() != 3) {
    return false;
  }

  // Initialize AttributeOctahedronTransform.
  const int quantization_bits = encoder->options()->GetAttributeInt(
      attribute_id, "quantization_bits", -1);
  if (quantization_bits < 1) {
    return false;
  }
  attribute_octahedron_transform_.SetParameters(quantization_bits);
  return true;
}